

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_rle.c
# Opt level: O1

exr_result_t
internal_exr_undo_rle
          (exr_decode_pipeline_t *decode,void *src,uint64_t packsz,void *out,uint64_t outsz)

{
  void **buf;
  exr_result_t eVar1;
  uint64_t uVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char cVar6;
  char *pcVar7;
  
  buf = &decode->scratch_buffer_1;
  eVar1 = internal_decode_alloc_buffer
                    (decode,EXR_TRANSCODE_BUFFER_SCRATCH1,buf,&decode->scratch_alloc_size_1,outsz);
  if (eVar1 == 0) {
    uVar2 = internal_rle_decompress((uint8_t *)*buf,outsz,(uint8_t *)src,packsz);
    eVar1 = 0x17;
    if (uVar2 == outsz) {
      pcVar3 = (char *)*buf;
      if (1 < (long)outsz) {
        pcVar4 = pcVar3 + 1;
        cVar6 = *pcVar3;
        do {
          cVar6 = cVar6 + *pcVar4 + -0x80;
          *pcVar4 = cVar6;
          pcVar4 = pcVar4 + 1;
        } while (pcVar4 < pcVar3 + outsz);
      }
      eVar1 = 0;
      if (0 < (long)outsz) {
        pcVar5 = pcVar3 + (outsz + 1 >> 1);
        pcVar4 = (char *)out;
        do {
          pcVar7 = pcVar4 + 1;
          *pcVar4 = *pcVar3;
          if (pcVar7 < (char *)(outsz + (long)out)) {
            cVar6 = *pcVar5;
            pcVar5 = pcVar5 + 1;
            pcVar4[1] = cVar6;
            pcVar7 = pcVar4 + 2;
          }
          pcVar3 = pcVar3 + 1;
          pcVar4 = pcVar7;
          eVar1 = 0;
        } while (pcVar7 < (char *)(outsz + (long)out));
      }
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
internal_exr_undo_rle (
    exr_decode_pipeline_t* decode,
    const void*            src,
    uint64_t               packsz,
    void*                  out,
    uint64_t               outsz)
{
    exr_result_t rv;
    uint64_t     unpackb;
    rv = internal_decode_alloc_buffer (
        decode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(decode->scratch_buffer_1),
        &(decode->scratch_alloc_size_1),
        outsz);
    if (rv != EXR_ERR_SUCCESS) return rv;

    unpackb =
        internal_rle_decompress ((uint8_t*) decode->scratch_buffer_1, outsz, (const uint8_t*) src, packsz);
    if (unpackb != outsz) return EXR_ERR_CORRUPT_CHUNK;

    unpredict_and_reorder (out, decode->scratch_buffer_1, outsz);
    return EXR_ERR_SUCCESS;
}